

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void __thiscall MasterObjectHolder::clearCore(MasterObjectHolder *this,int index)

{
  _Map_pointer ppuVar1;
  _Elt_pointer puVar2;
  unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *puVar3;
  ulong uVar4;
  unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *puVar5;
  ulong uVar6;
  _Map_pointer ppuVar7;
  unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *puVar8;
  __uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *this_00;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  handle coreList;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &(this->cores).m_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  ppuVar1 = (this->cores).m_obj.
            super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppuVar7 = (this->cores).m_obj.
            super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  if ((index < 0) ||
     (puVar2 = (this->cores).m_obj.
               super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur,
     (int)((int)((ulong)((long)(this->cores).m_obj.
                               super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_last - (long)puVar2) >> 3
                ) + (int)((ulong)((long)(this->cores).m_obj.
                                        super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                 (long)(this->cores).m_obj.
                                       super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
          ((((uint)((int)ppuVar1 - (int)ppuVar7) >> 3) - 1) + (uint)(ppuVar1 == (_Map_pointer)0x0))
          * 0x40) <= index)) goto LAB_00197539;
  uVar6 = ((long)puVar2 -
           (long)(this->cores).m_obj.
                 super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) + (ulong)(uint)index;
  if ((long)uVar6 < 0) {
    uVar4 = (long)uVar6 >> 6;
LAB_0019739e:
    puVar8 = ppuVar7[uVar4];
    (puVar8[(uint)uVar6 & 0x3f]._M_t.
     super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
     super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
     super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl)->valid = 0;
    this_00 = (__uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
              (puVar8 + uVar6 + uVar4 * -0x40);
  }
  else {
    if (0x3f < uVar6) {
      uVar4 = uVar6 >> 6;
      goto LAB_0019739e;
    }
    this_00 = (__uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
              (puVar2 + (uint)index);
    ((((__uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
      &(this_00->_M_t).
       super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)->_M_t
     ).super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
     super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl)->valid = 0;
  }
  std::__uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::reset
            (this_00,(pointer)0x0);
  ppuVar1 = (this->cores).m_obj.
            super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppuVar7 = (this->cores).m_obj.
            super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar11 = (((ulong)((long)ppuVar1 - (long)ppuVar7) >> 3) - (ulong)(ppuVar1 != (_Map_pointer)0x0)) *
           0x40;
  puVar3 = (this->cores).m_obj.
           super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  lVar9 = (long)puVar3 -
          (long)(this->cores).m_obj.
                super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3;
  puVar5 = (this->cores).m_obj.
           super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  puVar8 = (this->cores).m_obj.
           super__Deque_base<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  lVar12 = ((long)puVar8 - (long)puVar5 >> 3) + lVar9;
  if ((ulong)(lVar12 + lVar11) < 0xb) goto LAB_00197539;
  lVar10 = lVar12 + lVar11 >> 2;
  if (0 < lVar10) {
    lVar10 = lVar10 + 1;
    do {
      if ((puVar5->_M_t).
          super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
          super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl != (CoreObject *)0x0)
      goto LAB_0019752f;
      puVar5 = puVar5 + 1;
      if (puVar5 == puVar8) {
        puVar5 = ppuVar7[1];
        ppuVar7 = ppuVar7 + 1;
        puVar8 = puVar5 + 0x40;
      }
      if ((puVar5->_M_t).
          super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
          super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl != (CoreObject *)0x0)
      goto LAB_0019752f;
      puVar5 = puVar5 + 1;
      if (puVar5 == puVar8) {
        puVar5 = ppuVar7[1];
        ppuVar7 = ppuVar7 + 1;
        puVar8 = puVar5 + 0x40;
      }
      if ((puVar5->_M_t).
          super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
          super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl != (CoreObject *)0x0)
      goto LAB_0019752f;
      puVar5 = puVar5 + 1;
      if (puVar5 == puVar8) {
        puVar5 = ppuVar7[1];
        ppuVar7 = ppuVar7 + 1;
        puVar8 = puVar5 + 0x40;
      }
      if ((puVar5->_M_t).
          super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
          super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl != (CoreObject *)0x0)
      goto LAB_0019752f;
      puVar5 = puVar5 + 1;
      if (puVar5 == puVar8) {
        puVar5 = ppuVar7[1];
        ppuVar7 = ppuVar7 + 1;
        puVar8 = puVar5 + 0x40;
      }
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
    lVar11 = (((ulong)((long)ppuVar1 - (long)ppuVar7) >> 3) - (ulong)(ppuVar1 != (_Map_pointer)0x0))
             * 0x40;
    lVar12 = ((long)puVar8 - (long)puVar5 >> 3) + lVar9;
  }
  lVar12 = lVar12 + lVar11;
  if (lVar12 == 1) {
LAB_00197529:
    if ((puVar5->_M_t).
        super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
        super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
        super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl != (CoreObject *)0x0)
    goto LAB_0019752f;
  }
  else {
    if (lVar12 == 2) {
LAB_00197516:
      if ((puVar5->_M_t).
          super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
          super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl == (CoreObject *)0x0) {
        puVar5 = puVar5 + 1;
        if (puVar5 == puVar8) {
          puVar5 = ppuVar7[1];
        }
        goto LAB_00197529;
      }
    }
    else {
      if (lVar12 != 3) goto LAB_00197534;
      if ((puVar5->_M_t).
          super___uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_>._M_t.
          super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
          super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl == (CoreObject *)0x0) {
        puVar5 = puVar5 + 1;
        if (puVar5 == puVar8) {
          puVar5 = ppuVar7[1];
          ppuVar7 = ppuVar7 + 1;
          puVar8 = puVar5 + 0x40;
        }
        goto LAB_00197516;
      }
    }
LAB_0019752f:
    if (puVar3 != puVar5) goto LAB_00197539;
  }
LAB_00197534:
  std::
  deque<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>,_std::allocator<std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>_>_>
  ::clear(&(this->cores).m_obj);
LAB_00197539:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void MasterObjectHolder::clearCore(int index)
{
    auto coreList = cores.lock();
    if ((index < static_cast<int>(coreList->size())) && (index >= 0)) {
        (*coreList)[index]->valid = 0;
        (*coreList)[index] = nullptr;
        if (coreList->size() > 10) {
            if (std::none_of(coreList->begin(), coreList->end(), [](const auto& core) { return static_cast<bool>(core); })) {
                coreList->clear();
            }
        }
    }
}